

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcSizeAfterConstraint(ImGuiWindow *window,ImVec2 new_size)

{
  ImGuiSizeCallback p_Var1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  ImGuiSizeCallbackData data;
  ImGuiSizeCallbackData local_40;
  
  pIVar2 = GImGui;
  if (((GImGui->NextWindowData).Flags & 0x10) != 0) {
    fVar8 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar10 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    fVar5 = new_size.x;
    fVar6 = new_size.y;
    if ((fVar8 < 0.0) || (fVar7 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar7 < 0.0)) {
      fVar8 = (window->SizeFull).x;
    }
    else {
      if (fVar5 <= fVar7) {
        fVar7 = fVar5;
      }
      fVar8 = (float)(-(uint)(fVar5 < fVar8) & (uint)fVar8 | ~-(uint)(fVar5 < fVar8) & (uint)fVar7);
    }
    if ((fVar10 < 0.0) || (fVar5 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar5 < 0.0))
    {
      fVar10 = (window->SizeFull).y;
    }
    else {
      if (fVar6 <= fVar5) {
        fVar5 = fVar6;
      }
      fVar10 = (float)(-(uint)(fVar6 < fVar10) & (uint)fVar10 |
                      ~-(uint)(fVar6 < fVar10) & (uint)fVar5);
    }
    IVar11.y = fVar10;
    IVar11.x = fVar8;
    p_Var1 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var1 != (ImGuiSizeCallback)0x0) {
      local_40.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_40.Pos = window->Pos;
      local_40.CurrentSize = window->SizeFull;
      local_40.DesiredSize = IVar11;
      (*p_Var1)(&local_40);
      IVar11 = local_40.DesiredSize;
    }
    new_size.x = (float)(int)IVar11.x;
    new_size.y = (float)(int)IVar11.y;
  }
  if ((window->Flags & 0x1000040U) == 0) {
    fVar8 = (pIVar2->Style).WindowMinSize.x;
    fVar10 = (pIVar2->Style).WindowMinSize.y;
    fVar5 = new_size.x;
    uVar3 = -(uint)(fVar8 <= fVar5);
    uVar4 = -(uint)(fVar10 <= new_size.y);
    fVar10 = (float)(~uVar4 & (uint)fVar10 | (uint)new_size.y & uVar4);
    fVar6 = 0.0;
    if ((window->Flags & 1U) == 0) {
      fVar6 = GImGui->FontBaseSize * window->FontWindowScale;
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        fVar6 = fVar6 * window->ParentWindow->FontWindowScale;
      }
      fVar7 = (GImGui->Style).FramePadding.y;
      fVar6 = fVar7 + fVar7 + fVar6;
    }
    fVar7 = ImGuiWindow::MenuBarHeight(window);
    fVar9 = (pIVar2->Style).WindowRounding + -1.0;
    fVar6 = (float)(~-(uint)(fVar9 <= 0.0) & (uint)fVar9) + fVar7 + fVar6;
    uVar4 = -(uint)(fVar6 <= fVar10);
    new_size.y = (float)(uVar4 & (uint)fVar10 | ~uVar4 & (uint)fVar6);
    new_size.x = (float)(~uVar3 & (uint)fVar8 | uVar3 & (uint)fVar5);
  }
  return new_size;
}

Assistant:

static ImVec2 CalcSizeAfterConstraint(ImGuiWindow* window, ImVec2 new_size)
{
    ImGuiContext& g = *GImGui;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = ImFloor(new_size.x);
        new_size.y = ImFloor(new_size.y);
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, window->TitleBarHeight() + window->MenuBarHeight() + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}